

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommylist.h
# Opt level: O0

void tommy_list_foreach(tommy_list *list,tommy_foreach_func *func)

{
  undefined8 *puVar1;
  long lVar2;
  long in_FS_OFFSET;
  void *data;
  tommy_node *node;
  tommy_foreach_func *func_local;
  tommy_list *list_local;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  data = tommy_list_head(list);
  while (data != (void *)0x0) {
    puVar1 = (undefined8 *)((long)data + 0x10);
    data = *data;
    (*func)((void *)*puVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void tommy_list_foreach(tommy_list* list, tommy_foreach_func* func)
{
	tommy_node* node = tommy_list_head(list);

	while (node) {
		void* data = node->data;
		node = node->next;
		func(data);
	}
}